

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O3

void __thiscall irr::io::SNamedPath::setPath(SNamedPath *this,path *p)

{
  path local_38;
  
  if (this != (SNamedPath *)p) {
    ::std::__cxx11::string::_M_assign((string *)this);
  }
  PathToName(&local_38,this,p);
  if (&this->InternalName != &local_38) {
    ::std::__cxx11::string::_M_assign((string *)&this->InternalName);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.str._M_dataplus._M_p != &local_38.str.field_2) {
    operator_delete(local_38.str._M_dataplus._M_p,local_38.str.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void setPath(const path &p)
	{
		Path = p;
		InternalName = PathToName(p);
	}